

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ReserveGrowth_Test::TestBody
          (RepeatedField_ReserveGrowth_Test *this)

{
  int iVar1;
  LogMessage *this_00;
  int iVar2;
  char *message;
  int iVar3;
  int iVar4;
  ulong uVar5;
  string_view str;
  int next;
  AssertionResult gtest_ar;
  uint local_5c;
  AssertHelper local_58;
  LogMessage local_50;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  uVar5 = 2;
  iVar3 = 4;
  do {
    local_5c = (uint)(uVar5 * 8 + 8 >> 2);
    iVar4 = (int)uVar5;
    iVar1 = 2;
    if (0 < iVar4) {
      if (iVar4 < 0x3ffffffc) {
        if (iVar4 == 1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x493,"capacity == 0 || capacity >= lower_limit");
          local_58.data_._0_4_ = iVar4;
          this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                              (&local_50,(int *)&local_58);
          str._M_str = " ";
          str._M_len = 1;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (this_00,str);
          local_58.data_._0_4_ = 2;
          absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_00,(int *)&local_58)
          ;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_50);
        }
        iVar2 = iVar4 * 2 + 2;
        iVar1 = iVar4 + 1;
        if (iVar4 + 1 < iVar2) {
          iVar1 = iVar2;
        }
      }
      else {
        iVar1 = 0x7fffffff;
      }
    }
    local_50.errno_saver_.saved_errno_ = iVar1;
    testing::internal::CmpHelperEQ<int,int>
              (local_40,"next",
               "(internal::CalculateReserveSize<int, sizeof(void*)>( size, size + 1))",
               (int *)&local_5c,(int *)&local_50);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      message = anon_var_dwarf_a12c75 + 5;
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_38->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x1cf,message);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_50._4_4_,local_50.errno_saver_.saved_errno_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_50._4_4_,local_50.errno_saver_.saved_errno_) + 8))();
      }
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
    uVar5 = (ulong)local_5c;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

TEST(RepeatedField, ReserveGrowth) {
  // Make sure the field capacity doubles in size on repeated reservation.
  for (int size = internal::RepeatedFieldLowerClampLimit<int, sizeof(void*)>(),
           i = 0;
       i < 4; ++i) {
    int next =
        sizeof(Arena*) >= sizeof(int)
            ?
            // for small enough elements, we double number of total bytes
            ((2 * (size * sizeof(int) + sizeof(Arena*))) - sizeof(Arena*)) /
                sizeof(int)
            :
            // we just double the number of elements if too large size.
            size * 2;
    EXPECT_EQ(next, (internal::CalculateReserveSize<int, sizeof(void*)>(
                        size, size + 1)));
    size = next;
  }
}